

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O0

void PLM::PredictVelOnXFace
               (Box *xebox,int ncomp,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  void *in_RDX;
  Box *in_RDI;
  void *in_R8;
  void *in_R9;
  double in_XMM0_Qa;
  Geometry *in_stack_00000008;
  undefined8 in_stack_00000018;
  bool has_extdir_or_ho_hi;
  bool has_extdir_or_ho_lo;
  pair<bool,_bool> extdir_lohi;
  int domain_ihi;
  int domain_ilo;
  Box *domain_box;
  Real dtdx;
  Real dx;
  undefined8 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined1 local_280 [32];
  anon_class_280_8_d7ec4506 *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  Box *in_stack_fffffffffffffdb0;
  undefined1 auStack_240 [64];
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  double local_180;
  undefined1 local_178 [64];
  undefined1 auStack_138 [64];
  int local_f8;
  int local_f4;
  undefined1 auStack_f0 [64];
  undefined1 auStack_b0 [64];
  double local_70;
  undefined8 local_68;
  byte local_5c;
  byte local_5b;
  pair<bool,_bool> local_5a;
  int local_58;
  int local_54;
  Box *local_50;
  double local_48;
  Real local_40;
  double local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  void *local_18;
  Box *local_8;
  
  local_38 = in_XMM0_Qa;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_40 = amrex::CoordSys::CellSize(&in_stack_00000008->super_CoordSys,0);
  local_48 = local_38 / local_40;
  local_50 = amrex::Geometry::Domain(in_stack_00000008);
  local_54 = amrex::Box::smallEnd(local_50,0);
  local_58 = amrex::Box::bigEnd(local_50,0);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x87a3a8);
  local_5a = anon_unknown.dwarf_434208::has_extdir_or_ho
                       ((BCRec *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                        (int)((ulong)in_stack_fffffffffffffd68 >> 0x20),
                        (int)in_stack_fffffffffffffd68);
  iVar1 = local_54;
  local_5b = local_5a.first & 1;
  local_5c = local_5a.second & 1;
  if (((ushort)local_5a & 1) == 0) {
LAB_0087a412:
    iVar1 = local_58;
    if ((local_5c & 1) != 0) {
      iVar2 = amrex::Box::bigEnd(local_8,0);
      if (iVar1 <= iVar2) goto LAB_0087a448;
    }
    memcpy(local_280,local_28,0x3c);
    memcpy(auStack_240,local_30,0x3c);
    memcpy(auStack_200,local_20,0x3c);
    memcpy(auStack_1c0,local_18,0x3c);
    local_180 = local_48;
    amrex::
    ParallelFor<int,PLM::PredictVelOnXFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__1,void>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,
               (anon_class_264_5_555ddbe8 *)in_stack_fffffffffffffda0);
  }
  else {
    iVar2 = amrex::Box::smallEnd(local_8,0);
    if (iVar1 < iVar2 + -1) goto LAB_0087a412;
LAB_0087a448:
    memcpy(local_178,local_28,0x3c);
    memcpy(auStack_138,local_30,0x3c);
    local_f8 = local_54;
    local_f4 = local_58;
    memcpy(auStack_f0,local_18,0x3c);
    memcpy(auStack_b0,local_20,0x3c);
    local_70 = local_48;
    local_68 = in_stack_00000018;
    amrex::
    ParallelFor<int,PLM::PredictVelOnXFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*)::__0,void>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,in_stack_fffffffffffffda0);
  }
  return;
}

Assistant:

void
PLM::PredictVelOnXFace ( Box const& xebox, int ncomp,
                         Array4<Real> const& Imx, Array4<Real> const& Ipx,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= xebox.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= xebox.bigEnd(0)))
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,domain_ilo,domain_ihi,Imx,Ipx,dtdx,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                    (bc.lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                    (bc.hi(0) == BCType::hoextrap);

            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i  ,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
    else
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,Ipx,Imx,dtdx]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope(i  ,j,k,n,order,q);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope(i-1,j,k,n,order,q);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
}